

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

Expression cnn::expr::reshape(Expression *x,Dim *d)

{
  ComputationGraph *arguments;
  undefined8 extraout_RDX;
  Expression EVar1;
  uint local_24;
  uint *local_20;
  uint local_18 [2];
  
  arguments = *(ComputationGraph **)d->d;
  local_24 = d->d[2];
  local_20 = &local_24;
  local_18[0] = 1;
  local_18[1] = 0;
  ComputationGraph::add_function<cnn::Reshape,cnn::Dim_const&>
            ((ComputationGraph *)&x->i,(initializer_list<cnn::VariableIndex> *)arguments,
             (Dim *)&local_20);
  x->pg = arguments;
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = (ComputationGraph *)x;
  return EVar1;
}

Assistant:

Expression reshape(const Expression& x, const Dim& d) { return Expression(x.pg, x.pg->add_function<Reshape>({x.i}, d)); }